

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void example1(string *fileName)

{
  vector<int,_std::allocator<int>_> *__n;
  void *__buf;
  vector<int,_std::allocator<int>_> corY;
  vector<int,_std::allocator<int>_> corX;
  gdsSTR fooSTR;
  gdscpp fooGDS;
  vector<int,_std::allocator<int>_> local_378;
  vector<int,_std::allocator<int>_> local_358;
  undefined1 local_338 [24];
  undefined4 uStack_320;
  undefined4 local_31c;
  undefined4 uStack_318;
  undefined8 uStack_314;
  undefined1 local_30c [68];
  gdsSTR local_2c8;
  gdscpp local_1d0;
  gdsSTR local_110;
  
  __n = &local_378;
  gdscpp::gdscpp(&local_1d0);
  local_2c8.name._M_dataplus._M_p = (pointer)&local_2c8.name.field_2;
  local_2c8.name._M_string_length = 0;
  local_2c8.name.field_2._M_local_buf[0] = '\0';
  local_2c8.heirarchical_level = 0;
  local_2c8.bounding_box[0] = 0;
  local_2c8.bounding_box[1] = 0;
  local_2c8.bounding_box[2] = 0;
  local_2c8.bounding_box[3] = 0;
  memset(&local_2c8.last_modified,0,0xc0);
  local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x1170dc);
  local_338._0_4_ = 0;
  local_338._4_4_ = 200;
  local_338._8_4_ = 400;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_358,local_338);
  local_338._0_4_ = 700;
  local_338._4_4_ = 900;
  local_338._8_4_ = 700;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_378,local_338);
  drawPath((gdsPATH *)local_338,1,5,&local_358,&local_378);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::emplace_back<gdsPATH>
            (&local_2c8.PATH,(gdsPATH *)local_338);
  gdsPATH::~gdsPATH((gdsPATH *)local_338);
  local_338._0_4_ = 200;
  local_338._4_4_ = 200;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_358,local_338,local_338 + 8);
  local_338._0_4_ = 900;
  local_338._4_4_ = 0;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_378,local_338);
  drawPath((gdsPATH *)local_338,1,5,&local_358,&local_378);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::emplace_back<gdsPATH>
            (&local_2c8.PATH,(gdsPATH *)local_338);
  gdsPATH::~gdsPATH((gdsPATH *)local_338);
  uStack_318 = 400;
  uStack_314 = 0;
  local_338._16_8_ = (pointer)0x96000000fa;
  uStack_320 = 0x96;
  local_31c = 400;
  local_338._0_4_ = 0;
  local_338._4_4_ = 0x96;
  local_338._8_4_ = 0x96;
  local_338._12_4_ = 0xfa;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_358,local_338,local_30c);
  uStack_318 = 400;
  uStack_314 = 400;
  local_338._16_8_ = (pointer)0x9600000096;
  uStack_320 = 0;
  local_31c = 0;
  local_338._0_4_ = 0;
  local_338._4_4_ = 0;
  local_338._8_4_ = 0xfa;
  local_338._12_4_ = 0xfa;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_378,local_338);
  drawBoundary((gdsBOUNDARY *)local_338,2,&local_358,&local_378);
  std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::emplace_back<gdsBOUNDARY>
            (&local_2c8.BOUNDARY,(gdsBOUNDARY *)local_338);
  gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_338);
  gdsSTR::gdsSTR(&local_110,&local_2c8);
  gdscpp::setSTR(&local_1d0,&local_110);
  gdsSTR::~gdsSTR(&local_110);
  gdscpp::write(&local_1d0,(int)fileName,__buf,(size_t)__n);
  if (local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  gdsSTR::~gdsSTR(&local_2c8);
  gdscpp::~gdscpp(&local_1d0);
  return;
}

Assistant:

void example1(const string &fileName)
{
  gdscpp fooGDS;
  gdsSTR fooSTR;

  vector<int> corX;
  vector<int> corY;

  fooSTR.name = "arrow_box";

  corX = {000, 200, 400};
  corY = {700, 900, 700};
  fooSTR.PATH.push_back(drawPath(1, 5, corX, corY));

  corX = {200, 200};
  corY = {900, 000};
  fooSTR.PATH.push_back(drawPath(1, 5, corX, corY));

  corX = {0, 150, 150, 250, 250, 150, 150, 400, 400, 000, 0};
  corY = {0, 000, 250, 250, 150, 150, 000, 000, 400, 400, 0};
  fooSTR.BOUNDARY.push_back(drawBoundary(2, corX, corY));

  fooGDS.setSTR(fooSTR);
  fooGDS.write(fileName);
}